

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void ym3526_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  byte bVar1;
  DEV_SMPL DVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  uint local_44;
  int lt;
  UINT32 i;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  UINT8 rhythm;
  FM_OPL *OPL;
  DEV_SMPL **buffer_local;
  UINT32 length_local;
  void *chip_local;
  
  bVar1 = *(byte *)((long)chip + 0x6f8);
  if (length == 0) {
    refresh_eg((FM_OPL *)chip);
  }
  else {
    pDVar3 = *buffer;
    pDVar4 = buffer[1];
    for (local_44 = 0; local_44 < length; local_44 = local_44 + 1) {
      *(undefined4 *)((long)chip + 0x17c4) = 0;
      advance_lfo((FM_OPL *)chip);
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x20));
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0xe0));
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x1a0));
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x260));
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 800));
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x3e0));
      if ((bVar1 & 0x20) == 0) {
        OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x4a0));
        OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x560));
        OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x620));
      }
      else {
        OPL_CALC_RH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x20),*(uint *)((long)chip + 0x1718) & 1)
        ;
      }
      DVar2 = *(DEV_SMPL *)((long)chip + 0x17c4);
      pDVar3[local_44] = DVar2;
      pDVar4[local_44] = DVar2;
      advance((FM_OPL *)chip);
    }
  }
  return;
}

Assistant:

void ym3526_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	FM_OPL      *OPL = (FM_OPL *)chip;
	UINT8       rhythm = OPL->rhythm&0x20;
	DEV_SMPL    *bufL;
	DEV_SMPL    *bufR;
	UINT32 i;

	if (! length)
	{
		refresh_eg(OPL);
		return;
	}
	
	bufL = buffer[0];
	bufR = buffer[1];
	for( i=0; i < length ; i++ )
	{
		int lt;

		OPL->output[0] = 0;

		advance_lfo(OPL);

		/* FM part */
		OPL_CALC_CH(OPL, &OPL->P_CH[0]);
		OPL_CALC_CH(OPL, &OPL->P_CH[1]);
		OPL_CALC_CH(OPL, &OPL->P_CH[2]);
		OPL_CALC_CH(OPL, &OPL->P_CH[3]);
		OPL_CALC_CH(OPL, &OPL->P_CH[4]);
		OPL_CALC_CH(OPL, &OPL->P_CH[5]);

		if(!rhythm)
		{
			OPL_CALC_CH(OPL, &OPL->P_CH[6]);
			OPL_CALC_CH(OPL, &OPL->P_CH[7]);
			OPL_CALC_CH(OPL, &OPL->P_CH[8]);
		}
		else        /* Rhythm part */
		{
			OPL_CALC_RH(OPL, &OPL->P_CH[0], (OPL->noise_rng>>0)&1 );
		}

		lt = OPL->output[0];

		/* store to sound buffer */
		bufL[i] = lt;
		bufR[i] = lt;

		advance(OPL);
	}

}